

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O2

int __thiscall Pyraminx::count_correct_edge(Pyraminx *this)

{
  Color CVar1;
  Color CVar2;
  Color CVar3;
  Color CVar4;
  uint uVar5;
  Corner ref_corner;
  __shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  uint uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  shared_ptr<Face> adjacent_face;
  shared_ptr<Face> current_face;
  
  std::__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>,
             &(this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>);
  iVar8 = 0;
  iVar9 = 3;
  while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
    std::__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>,
               &((current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                neighbors).U_neighbor_right.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>);
    CVar1 = Face::get_triangle_color
                      (current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,U,1,
                       2);
    CVar2 = Face::get_triangle_color
                      (current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,U,2,
                       4);
    CVar3 = Face::get_triangle_color
                      (adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,U,1
                       ,0);
    CVar4 = Face::get_triangle_color
                      (adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,U,2
                       ,0);
    uVar5 = 0;
    uVar7 = 0;
    if (CVar1 == (current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 center_color) {
      uVar7 = (uint)(CVar3 == (adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->center_color);
    }
    if (CVar2 == (current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 center_color) {
      uVar5 = (uint)(CVar4 == (adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->center_color);
    }
    iVar8 = uVar7 + iVar8 + uVar5;
    std::__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>,
               &adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  for (iVar9 = 0; iVar9 != 3; iVar9 = iVar9 + 1) {
    adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var6 = &(this->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>;
    ref_corner = L;
    if ((iVar9 != 0) &&
       (p_Var6 = &(this->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>,
       ref_corner = R, iVar9 == 2)) {
      p_Var6 = &(this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>;
      ref_corner = B;
    }
    std::__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>,p_Var6);
    CVar1 = Face::get_triangle_color
                      ((this->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,ref_corner,3,2);
    CVar2 = Face::get_triangle_color
                      ((this->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,ref_corner,3,4);
    CVar3 = Face::get_triangle_color
                      (adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,U,3
                       ,2);
    CVar4 = Face::get_triangle_color
                      (adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,U,3
                       ,4);
    uVar5 = 0;
    uVar7 = 0;
    if (CVar1 == green) {
      uVar7 = (uint)(CVar4 == (adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->center_color);
    }
    if (CVar2 == green) {
      uVar5 = (uint)(CVar3 == (adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->center_color);
    }
    iVar8 = uVar7 + iVar8 + uVar5;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return iVar8;
}

Assistant:

int Pyraminx::count_correct_edge(){
    int count = 0;
    // Check the edges between faces sharing the upper corner
    std::shared_ptr<Face> current_face = blue_face;
    for(int i = 0; i < 3; i++){
        std::shared_ptr<Face> adjacent_face = current_face->neighbors.U_neighbor_right;
        Color current_top = current_face->get_triangle_color(Corner::U, 1, 2);
        Color current_bottom = current_face->get_triangle_color(Corner::U, 2, 4);
        Color adjacent_top = adjacent_face->get_triangle_color(Corner::U, 1, 0);
        Color adjacent_bottom = adjacent_face->get_triangle_color(Corner::U, 2, 0);
        int top_correct = (current_top == current_face->get_center_color()) 
            && (adjacent_top == adjacent_face->get_center_color());
        int bottom_correct = (current_bottom == current_face->get_center_color()) 
            && (adjacent_bottom == adjacent_face->get_center_color());
        count = count + top_correct + bottom_correct;
        current_face = adjacent_face;
    }
    // Check the edges between the bottom face (green) and the others
    for(int i = 0; i < 3; i++){
        std::shared_ptr<Face> adjacent_face;
        Corner current_corner;
        switch (i)
        {
        case 0:
            current_corner = Corner::L;
            adjacent_face = yellow_face;
            break;
        case 1:
            current_corner = Corner::R;
            adjacent_face = red_face;
            break;
        case 2:
            current_corner = Corner::B;
            adjacent_face = blue_face;
            break;
        }

        Color current_left  = green_face->get_triangle_color(current_corner, 3, 2);
        Color current_right = green_face->get_triangle_color(current_corner, 3, 4);

        Color adjacent_right = adjacent_face->get_triangle_color(Corner::U, 3, 2);
        Color adjacent_left = adjacent_face->get_triangle_color(Corner::U, 3, 4);

        int left_correct = (current_left == Color::green) && (adjacent_left == adjacent_face->get_center_color());
        int right_correct = (current_right == Color::green) && (adjacent_right == adjacent_face->get_center_color());

        count = count + left_correct + right_correct;
    }
    //printf("Correct edge pieces: %i/12\n", count);
    return count;
}